

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool ELFIO::elfio::is_subsequence_of(segment *seg1,segment *seg2)

{
  int iVar1;
  undefined4 extraout_var;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  size_type sVar2;
  size_type sVar3;
  const_iterator __first1;
  const_iterator __last1;
  const_iterator __first2;
  const_iterator __last2;
  bool local_29;
  bool found;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *sections2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *sections1;
  segment *seg2_local;
  segment *seg1_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this;
  undefined4 extraout_var_00;
  
  iVar1 = (*seg1->_vptr_segment[0x1b])();
  this = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*seg2->_vptr_segment[0x1b])();
  this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
            CONCAT44(extraout_var_00,iVar1);
  local_29 = false;
  sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(this);
  sVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(this_00);
  if (sVar2 < sVar3) {
    __first1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(this_00);
    __last1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(this_00);
    __first2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(this);
    __last2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(this);
    local_29 = std::
               includes<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                         ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                           )__first1._M_current,
                          (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                           )__last1._M_current,
                          (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                           )__first2._M_current,
                          (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                           )__last2._M_current);
  }
  return local_29;
}

Assistant:

static bool is_subsequence_of( const segment* seg1, const segment* seg2 )
    {
        // Return 'true' if sections of seg1 are a subset of sections in seg2
        const std::vector<Elf_Half>& sections1 = seg1->get_sections();
        const std::vector<Elf_Half>& sections2 = seg2->get_sections();

        bool found = false;
        if ( sections1.size() < sections2.size() ) {
            found = std::includes( sections2.begin(), sections2.end(),
                                   sections1.begin(), sections1.end() );
        }

        return found;
    }